

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

void __thiscall
despot::PlannerBase::DisplayParameters(PlannerBase *this,Option *options,DSPOMDP *model)

{
  undefined8 uVar1;
  Option *pOVar2;
  ostream *poVar3;
  char *pcVar4;
  void *pvVar5;
  char *local_a8;
  char *local_88;
  allocator<char> local_79;
  string local_78 [8];
  string ubtype;
  allocator<char> local_41;
  string local_40 [8];
  string lbtype;
  DSPOMDP *model_local;
  Option *options_local;
  PlannerBase *this_local;
  
  lbtype.field_2._8_8_ = model;
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x13);
  if (pOVar2 == (Option *)0x0) {
    local_88 = "DEFAULT";
  }
  else {
    local_88 = options[0x13].arg;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,local_88,&local_41);
  std::allocator<char>::~allocator(&local_41);
  pOVar2 = option::Option::operator_cast_to_Option_(options + 0x15);
  if (pOVar2 == (Option *)0x0) {
    local_a8 = "DEFAULT";
  }
  else {
    local_a8 = options[0x15].arg;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_78,local_a8,&local_79);
  std::allocator<char>::~allocator(&local_79);
  if ((DAT_00278ac0 & 1) == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Model = ");
    uVar1 = lbtype.field_2._8_8_;
    if (lbtype.field_2._8_8_ == 0) {
      __cxa_bad_typeid();
    }
    pcVar4 = std::type_info::name(*(type_info **)(*(long *)uVar1 + -8));
    poVar3 = std::operator<<(poVar3,pcVar4);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Random root seed = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a90);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Search depth = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a70);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Discount = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a78);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Simulation steps = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a68);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Number of scenarios = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a6c);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Search time per step = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,Globals::config);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Regularization constant = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a80);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Lower bound = ");
    poVar3 = std::operator<<(poVar3,local_40);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Upper bound = ");
    poVar3 = std::operator<<(poVar3,local_78);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Policy simulation depth = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a74);
    poVar3 = (ostream *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    poVar3 = std::operator<<(poVar3,"Target gap ratio = ");
    pvVar5 = (void *)std::ostream::operator<<(poVar3,DAT_00278a88);
    std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void PlannerBase::DisplayParameters(option::Option *options, DSPOMDP *model) {

	string lbtype = options[E_LBTYPE] ? options[E_LBTYPE].arg : "DEFAULT";
	string ubtype = options[E_UBTYPE] ? options[E_UBTYPE].arg : "DEFAULT";
	default_out<< "Model = " << typeid(*model).name() << endl
	<< "Random root seed = " << Globals::config.root_seed << endl
	<< "Search depth = " << Globals::config.search_depth << endl
	<< "Discount = " << Globals::config.discount << endl
	<< "Simulation steps = " << Globals::config.sim_len << endl
	<< "Number of scenarios = " << Globals::config.num_scenarios
	<< endl
	<< "Search time per step = " << Globals::config.time_per_move
	<< endl
	<< "Regularization constant = "
	<< Globals::config.pruning_constant << endl
	<< "Lower bound = " << lbtype << endl
	<< "Upper bound = " << ubtype << endl
	<< "Policy simulation depth = "
	<< Globals::config.max_policy_sim_len << endl
	<< "Target gap ratio = " << Globals::config.xi << endl;
	// << "Solver = " << typeid(*solver).name() << endl << endl;
}